

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

ON_Interval __thiscall
ON_PlaneEquation::ValueRange(ON_PlaneEquation *this,size_t point_list_count,ON_3dPoint *point_list)

{
  ON_Interval OVar1;
  ON_3dPointListRef local_18;
  
  local_18.m_point_count = 0;
  local_18.m_point_stride = 0;
  local_18.m_dP = (double *)0x0;
  local_18.m_fP = (float *)0x0;
  if (point_list == (ON_3dPoint *)0x0 || 0x7ffffffe < point_list_count - 1 >> 1) {
    point_list_count = 0;
  }
  else {
    local_18.m_point_stride = 3;
    local_18.m_point_count = (uint)point_list_count;
    local_18.m_dP = &point_list->x;
  }
  OVar1 = ValueRange(this,point_list_count,1,(uint *)0x0,&local_18);
  return (ON_Interval)OVar1.m_t;
}

Assistant:

ON_Interval ON_PlaneEquation::ValueRange(
  size_t point_list_count,
  const ON_3dPoint* point_list
  ) const
{
  ON_3dPointListRef vertex_list;
  vertex_list.SetFromDoubleArray(point_list_count,3,(const double*)point_list);
  return ValueRange(vertex_list);
}